

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<capnp::Response<capnp::DynamicStruct>_> * __thiscall
kj::_::NullableValue<capnp::Response<capnp::DynamicStruct>_>::operator=
          (NullableValue<capnp::Response<capnp::DynamicStruct>_> *this,
          NullableValue<capnp::Response<capnp::DynamicStruct>_> *other)

{
  RawBrandedSchema *pRVar1;
  SegmentReader *pSVar2;
  CapTableReader *pCVar3;
  void *pvVar4;
  ResponseHook *pRVar5;
  undefined4 uVar6;
  StructDataBitCount SVar7;
  StructPointerCount SVar8;
  undefined2 uVar9;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      Own<capnp::ResponseHook>::dispose(&(this->field_1).value.hook);
    }
    if (other->isSet == true) {
      uVar6 = *(undefined4 *)((long)&other->field_1 + 0x34);
      *(int *)((long)&this->field_1 + 0x30) = *(int *)((long)&other->field_1 + 0x30);
      *(undefined4 *)((long)&this->field_1 + 0x34) = uVar6;
      pRVar1 = (other->field_1).value.super_Reader.schema.super_Schema.raw;
      pSVar2 = (other->field_1).value.super_Reader.reader.segment;
      pCVar3 = (other->field_1).value.super_Reader.reader.capTable;
      pvVar4 = (other->field_1).value.super_Reader.reader.data;
      SVar7 = *(StructDataBitCount *)((long)&other->field_1 + 0x28);
      SVar8 = *(StructPointerCount *)((long)&other->field_1 + 0x2c);
      uVar9 = *(undefined2 *)((long)&other->field_1 + 0x2e);
      (this->field_1).value.super_Reader.reader.pointers =
           (other->field_1).value.super_Reader.reader.pointers;
      *(StructDataBitCount *)((long)&this->field_1 + 0x28) = SVar7;
      *(StructPointerCount *)((long)&this->field_1 + 0x2c) = SVar8;
      *(undefined2 *)((long)&this->field_1 + 0x2e) = uVar9;
      (this->field_1).value.super_Reader.reader.capTable = pCVar3;
      (this->field_1).value.super_Reader.reader.data = pvVar4;
      (this->field_1).value.super_Reader.schema.super_Schema.raw = pRVar1;
      (this->field_1).value.super_Reader.reader.segment = pSVar2;
      pRVar5 = (other->field_1).value.hook.ptr;
      (this->field_1).value.hook.disposer = (other->field_1).value.hook.disposer;
      (this->field_1).value.hook.ptr = pRVar5;
      (other->field_1).value.hook.ptr = (ResponseHook *)0x0;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }